

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::PushNameWithSuffix
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *suffixes,char *suffix)

{
  char *pcVar1;
  value_type local_38 [32];
  char *local_18;
  char *suffix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *suffixes_local;
  
  local_18 = suffix;
  suffix_local = (char *)suffixes;
  pcVar1 = ProgramInvocationShortName();
  StringPrintf_abi_cxx11_((char *)local_38,"/%s%s",pcVar1,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(suffixes,local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void PushNameWithSuffix(vector<string>* suffixes, const char* suffix) {
  suffixes->push_back(
      StringPrintf("/%s%s", ProgramInvocationShortName(), suffix));
}